

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O1

void __thiscall n_e_s::core::Ppu::execute_vblank_scanline(Ppu *this)

{
  PpuRegisters *pPVar1;
  
  pPVar1 = this->registers_;
  if (((pPVar1->scanline == 0xf1) && (pPVar1->cycle == 1)) &&
     ((pPVar1->status).value_ = (pPVar1->status).value_ | 0x80, (char)(pPVar1->ctrl).value_ < '\0'))
  {
    if ((this->on_nmi_).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->on_nmi_)._M_invoker)((_Any_data *)&this->on_nmi_);
      return;
    }
    std::__throw_bad_function_call();
  }
  return;
}

Assistant:

uint16_t &Ppu::scanline() {
    return registers_->scanline;
}